

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDivsMusashi<(moira::Core)2,(moira::Instr)54,(moira::Mode)2,2>
          (Moira *this,u16 opcode,bool *divByZero)

{
  u32 uVar1;
  u32 dividend;
  u32 result;
  u32 divisor;
  u32 ea;
  i64 c;
  int dst;
  int src;
  bool *divByZero_local;
  Moira *pMStack_10;
  u16 opcode_local;
  Moira *this_local;
  
  c._4_4_ = opcode & 7;
  c._0_4_ = (int)(uint)opcode >> 9 & 7;
  _divisor = this->clock;
  _dst = divByZero;
  divByZero_local._6_2_ = opcode;
  pMStack_10 = this;
  readOp<(moira::Core)2,(moira::Mode)2,2,0ull>(this,c._4_4_,&result,&dividend);
  if (dividend == 0) {
    execException<(moira::Core)2>(this,DIVIDE_BY_ZERO,0);
    *_dst = true;
  }
  else {
    uVar1 = readD<4>(this,(uint)c);
    uVar1 = divsMusashi<(moira::Core)2>(this,uVar1,dividend);
    writeD<4>(this,(uint)c,uVar1);
    prefetch<(moira::Core)2,4ull>(this);
  }
  return;
}

Assistant:

void
Moira::execDivsMusashi(u16 opcode, bool *divByZero)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    [[maybe_unused]] i64 c = clock;

    u32 ea, divisor, result;
    readOp<C, M, Word>(src, &ea, &divisor);

    if (divisor == 0) {

        if constexpr (C == Core::C68000) {
            SYNC(8 - (int)(clock - c));
        } else {
            SYNC(10 - (int)(clock - c));
        }
        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return;
    }

    u32 dividend = readD(dst);
    result = divsMusashi<C>(dividend, divisor);

    SYNC_68000(154);
    SYNC_68010(118);

    writeD(dst, result);
    prefetch<C, POLL>();
}